

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::icdf
          (result_type_conflict3 *__return_storage_ptr__,beta_dist<long_double> *this,
          result_type_conflict3 x)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined8 in_RAX;
  result_type_conflict3 *prVar3;
  
  lVar2 = (longdouble)0;
  prVar3 = (result_type_conflict3 *)CONCAT71((int7)((ulong)in_RAX >> 8),lVar2 <= x._0_10_);
  lVar1 = (longdouble)1;
  if (lVar2 <= x._0_10_ && x._0_10_ <= lVar1) {
    if (((x._0_10_ != lVar2) || (NAN(x._0_10_) || NAN(lVar2))) &&
       ((x._0_10_ != lVar1 || (NAN(x._0_10_) || NAN(lVar1))))) {
      prVar3 = (result_type_conflict3 *)
               math::detail::inv_Beta_I<long_double>
                         ((longdouble *)__return_storage_ptr__,x._0_10_,
                          *(longdouble *)__return_storage_ptr__,
                          *(longdouble *)(__return_storage_ptr__ + 1),
                          *(longdouble *)(__return_storage_ptr__ + 2));
    }
  }
  else {
    prVar3 = (result_type_conflict3 *)__errno_location();
    *(int *)prVar3 = 0x21;
  }
  return prVar3;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return 1;
      return math::inv_Beta_I(x, P.alpha(), P.beta(), P.norm());
    }